

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

void spvPushOperandTypes(spv_operand_type_t *types,spv_operand_pattern_t *pattern)

{
  int *piVar1;
  iterator __position;
  long lVar2;
  
  lVar2 = 0;
  do {
    piVar1 = (int *)((long)types + lVar2);
    lVar2 = lVar2 + 4;
  } while (*piVar1 != 0);
  for (; lVar2 != 4; lVar2 = lVar2 + -4) {
    __position._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
      _M_realloc_insert<spv_operand_type_t_const&>
                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,__position
                 ,(spv_operand_type_t *)((long)types + lVar2 + -8));
    }
    else {
      *__position._M_current = *(spv_operand_type_t *)((long)types + lVar2 + -8);
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void spvPushOperandTypes(const spv_operand_type_t* types,
                         spv_operand_pattern_t* pattern) {
  const spv_operand_type_t* endTypes;
  for (endTypes = types; *endTypes != SPV_OPERAND_TYPE_NONE; ++endTypes) {
  }

  while (endTypes-- != types) {
    pattern->push_back(*endTypes);
  }
}